

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void inssort(uchar **a,int n,int d)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  uchar **ppuVar5;
  long lVar6;
  
  ppuVar4 = a;
  do {
    if (n < 2) {
      return;
    }
    ppuVar4 = ppuVar4 + 1;
    n = n + -1;
    puVar3 = *ppuVar4;
    ppuVar5 = ppuVar4;
    while (a < ppuVar5) {
      lVar6 = (long)d;
      while( true ) {
        bVar1 = ppuVar5[-1][lVar6];
        bVar2 = puVar3[lVar6];
        if ((bVar1 == 0) || (bVar1 != bVar2)) break;
        lVar6 = lVar6 + 1;
      }
      if (bVar1 <= bVar2) break;
      *ppuVar5 = ppuVar5[-1];
      ppuVar5 = ppuVar5 + -1;
    }
    *ppuVar5 = puVar3;
  } while( true );
}

Assistant:

void
inssort(unsigned char** a, int n, int d)
{
	unsigned char** pi;
	unsigned char** pj;
	unsigned char* s;
	unsigned char* t;

	for (pi = a + 1; --n > 0; pi++) {
		unsigned char* tmp = *pi;

		for (pj = pi; pj > a; pj--) {
			for (s=*(pj-1)+d, t=tmp+d; *s==*t && *s!=0; ++s, ++t)
				;
			if (*s <= *t)
				break;
			*pj = *(pj-1);
		}
		*pj = tmp;
	}
}